

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O0

void hadamard_col4(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  int16_t b3;
  int16_t b2;
  int16_t b1;
  int16_t b0;
  int16_t *coeff_local;
  ptrdiff_t src_stride_local;
  int16_t *src_diff_local;
  
  sVar1 = (short)((int)*src_diff + (int)src_diff[src_stride] >> 1);
  sVar2 = (short)((int)*src_diff - (int)src_diff[src_stride] >> 1);
  sVar3 = (short)((int)src_diff[src_stride * 2] + (int)src_diff[src_stride * 3] >> 1);
  sVar4 = (short)((int)src_diff[src_stride * 2] - (int)src_diff[src_stride * 3] >> 1);
  *coeff = sVar1 + sVar3;
  coeff[1] = sVar2 + sVar4;
  coeff[2] = sVar1 - sVar3;
  coeff[3] = sVar2 - sVar4;
  return;
}

Assistant:

static void hadamard_col4(const int16_t *src_diff, ptrdiff_t src_stride,
                          int16_t *coeff) {
  int16_t b0 = (src_diff[0 * src_stride] + src_diff[1 * src_stride]) >> 1;
  int16_t b1 = (src_diff[0 * src_stride] - src_diff[1 * src_stride]) >> 1;
  int16_t b2 = (src_diff[2 * src_stride] + src_diff[3 * src_stride]) >> 1;
  int16_t b3 = (src_diff[2 * src_stride] - src_diff[3 * src_stride]) >> 1;

  coeff[0] = b0 + b2;
  coeff[1] = b1 + b3;
  coeff[2] = b0 - b2;
  coeff[3] = b1 - b3;
}